

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase315::run(TestCase315 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  Reader brand_00;
  Schema SVar2;
  Schema dep;
  Schema schema;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_1ef;
  bool local_1c0;
  ArrayPtr<const_char> local_1b8;
  Schema local_1a8;
  ArrayPtr<const_char> local_1a0;
  SchemaLoader loader;
  Reader local_100;
  Reader local_d0;
  LazyLoadCallback local_a0;
  SegmentReader *local_98;
  CapTableReader *pCStack_90;
  void *local_88;
  WirePointer *pWStack_80;
  StructDataBitCount local_78;
  StructPointerCount SStack_74;
  undefined2 uStack_72;
  int iStack_70;
  undefined4 uStack_6c;
  char local_68;
  Reader local_60;
  
  __kjCondition = (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto(&local_60,(Schema *)&_kjCondition);
  local_78 = local_60._reader.dataSize;
  SStack_74 = local_60._reader.pointerCount;
  uStack_72 = local_60._reader._38_2_;
  iStack_70 = local_60._reader.nestingLimit;
  uStack_6c = local_60._reader._44_4_;
  local_88 = local_60._reader.data;
  pWStack_80 = local_60._reader.pointers;
  local_98 = local_60._reader.segment;
  pCStack_90 = local_60._reader.capTable;
  local_a0._vptr_LazyLoadCallback = (_func_int **)&PTR_load_0064e980;
  local_68 = '\0';
  SchemaLoader::SchemaLoader(&loader,&local_a0);
  local_100._reader.segment = (SegmentReader *)(schemas::s_eb3f9ebe98c73cb6 + 0x48);
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&local_100);
  schema = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  __kjCondition = (RawBrandedSchema *)(CONCAT71(uStack_1ef,local_68) ^ 1);
  if ((local_68 == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x141,ERROR,"\"failed: expected \" \"!(callback.isLoaded())\", _kjCondition",
               (char (*) [40])"failed: expected !(callback.isLoaded())",&_kjCondition);
  }
  dep = Schema::getDependency(&schema,0xa0a8f314b80b63fd);
  _kjCondition.value = (bool)local_68;
  if ((local_68 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x145,ERROR,"\"failed: expected \" \"callback.isLoaded()\", _kjCondition",
               (char (*) [37])"failed: expected callback.isLoaded()",&_kjCondition);
  }
  Schema::getProto(&local_100,&dep);
  local_1b8 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_100);
  local_1a8.raw = (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto(&local_d0,&local_1a8);
  local_1a0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_d0);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<capnp::Text::Reader> *)&local_1b8,(Reader *)&local_1a0);
  if ((local_1c0 == false) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto(&local_100,&dep);
    local_1b8 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_100);
    local_1a8.raw = (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48);
    Schema::getProto(&local_d0,&local_1a8);
    local_1a0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_d0);
    kj::_::Debug::
    log<char_const(&)[113],kj::_::DebugComparison<capnp::Text::Reader,capnp::Text::Reader>&,capnp::Text::Reader,capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x148,ERROR,
               "\"failed: expected \" \"(dep.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())\", _kjCondition, dep.getProto().getDisplayName(), Schema::from<TestAllTypes>().getProto().getDisplayName()"
               ,(char (*) [113])
                "failed: expected (dep.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())"
               ,(DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)&_kjCondition,
               (Reader *)&local_1b8,(Reader *)&local_1a0);
  }
  SVar2 = Schema::getDependency(&schema,0xa0a8f314b80b63fd);
  __kjCondition = (RawBrandedSchema *)&dep;
  if ((dep.raw != SVar2.raw) && (kj::_::Debug::minSeverity < 3)) {
    local_100._reader.segment = (SegmentReader *)Schema::getDependency(&schema,0xa0a8f314b80b63fd);
    kj::_::Debug::
    log<char_const(&)[73],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x14a,ERROR,
               "\"failed: expected \" \"(dep) == (schema.getDependency(typeId<TestAllTypes>()))\", _kjCondition, dep, schema.getDependency(typeId<TestAllTypes>())"
               ,(char (*) [73])
                "failed: expected (dep) == (schema.getDependency(typeId<TestAllTypes>()))",
               (DebugComparison<capnp::Schema_&,_capnp::Schema> *)&_kjCondition,&dep,
               (Schema *)&local_100);
  }
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  SVar2 = SchemaLoader::get(&loader,0xa0a8f314b80b63fd,brand,(Schema)0x669c88);
  __kjCondition = (RawBrandedSchema *)&dep;
  if ((dep.raw != SVar2.raw) && (kj::_::Debug::minSeverity < 3)) {
    auVar1 = ZEXT1640(ZEXT816(0));
    brand_00._reader._40_8_ = 0x7fffffff;
    brand_00._reader.segment = (SegmentReader *)auVar1._0_8_;
    brand_00._reader.capTable = (CapTableReader *)auVar1._8_8_;
    brand_00._reader.data = (void *)auVar1._16_8_;
    brand_00._reader.pointers = (WirePointer *)auVar1._24_8_;
    brand_00._reader.dataSize = auVar1._32_4_;
    brand_00._reader.pointerCount = auVar1._36_2_;
    brand_00._reader._38_2_ = auVar1._38_2_;
    local_100._reader.segment =
         (SegmentReader *)SchemaLoader::get(&loader,0xa0a8f314b80b63fd,brand_00,(Schema)0x669c88);
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x14b,ERROR,
               "\"failed: expected \" \"(dep) == (loader.get(typeId<TestAllTypes>()))\", _kjCondition, dep, loader.get(typeId<TestAllTypes>())"
               ,(char (*) [63])"failed: expected (dep) == (loader.get(typeId<TestAllTypes>()))",
               (DebugComparison<capnp::Schema_&,_capnp::Schema> *)&_kjCondition,&dep,
               (Schema *)&local_100);
  }
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, LazyLoadGetDependency) {
  FakeLoaderCallback callback(Schema::from<TestAllTypes>().getProto());
  SchemaLoader loader(callback);

  Schema schema = loader.load(Schema::from<TestDefaults>().getProto());

  EXPECT_FALSE(callback.isLoaded());

  Schema dep = schema.getDependency(typeId<TestAllTypes>());

  EXPECT_TRUE(callback.isLoaded());

  EXPECT_EQ(dep.getProto().getDisplayName(),
            Schema::from<TestAllTypes>().getProto().getDisplayName());

  EXPECT_EQ(dep, schema.getDependency(typeId<TestAllTypes>()));
  EXPECT_EQ(dep, loader.get(typeId<TestAllTypes>()));
}